

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rom2snsf.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  uint uVar1;
  char cVar2;
  bool bVar3;
  int iVar4;
  int *piVar5;
  char *pcVar6;
  size_t sVar7;
  mapped_type *pmVar8;
  char *pcVar9;
  int iVar10;
  long lVar11;
  size_t sStack_20d0;
  allocator local_20c1;
  long local_20c0;
  uint local_20b4;
  char *local_20b0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_20a8;
  char *endptr;
  char **local_2070;
  long local_2068;
  char *local_2060;
  key_type local_2058;
  char snsf_path [4096];
  char libname [4096];
  
  if (argc == 1) {
LAB_001057bc:
    usage(*argv);
  }
  else {
    iVar10 = 1;
    endptr = (char *)0x0;
    local_20b0 = (char *)0x0;
    memset(snsf_path,0,0x1000);
    memset(libname,0,0x1000);
    local_20c0 = 0;
    while ((iVar10 < argc && (pcVar6 = argv[iVar10], *pcVar6 == '-'))) {
      iVar4 = strcmp(pcVar6,"--help");
      if (iVar4 == 0) goto LAB_001057bc;
      if ((pcVar6[1] != 'o') || (pcVar6[2] != '\0')) {
        iVar4 = strcmp(pcVar6,"--load");
        if (iVar4 == 0) {
          iVar4 = iVar10 + 1;
          if (iVar4 < argc) {
            local_20c0 = strtol(argv[iVar4],&endptr,0x10);
            if (((*endptr != '\0') || (piVar5 = __errno_location(), *piVar5 == 0x22)) ||
               (local_20c0 < 0)) {
              pcVar6 = argv[iVar4];
              pcVar9 = "Error: Number format error \"%s\"\n";
              goto LAB_00105c04;
            }
            if (0x7fffff < (uint)local_20c0) {
              fprintf(_stderr,"Error: Load offset too large 0x%08X\n",local_20c0);
              return 1;
            }
            goto LAB_00105965;
          }
        }
        else {
          iVar4 = strcmp(pcVar6,"--lib");
          if (iVar4 == 0) {
            if (iVar10 + 1 < argc) {
              pcVar9 = argv[iVar10 + 1];
              pcVar6 = libname;
              goto LAB_00105960;
            }
          }
          else {
            iVar4 = strcmp(pcVar6,"--psfby");
            if ((iVar4 != 0) && (iVar4 = strcmp(pcVar6,"--snsfby"), iVar4 != 0)) {
              pcVar9 = "Error: Unknown option \"%s\"\n";
              goto LAB_00105c04;
            }
            if (iVar10 + 1 < argc) {
              local_20b0 = argv[iVar10 + 1];
              goto LAB_00105965;
            }
          }
        }
LAB_00105bd9:
        pcVar9 = "Error: Too few arguments for \"%s\"\n";
LAB_00105c04:
        fprintf(_stderr,pcVar9,pcVar6);
        return 1;
      }
      if (argc <= iVar10 + 1) goto LAB_00105bd9;
      pcVar9 = argv[iVar10 + 1];
      pcVar6 = snsf_path;
LAB_00105960:
      strcpy(pcVar6,pcVar9);
LAB_00105965:
      iVar10 = iVar10 + 2;
    }
    if (argc == iVar10) {
      pcVar6 = "Error: Too few arguments\n";
      sStack_20d0 = 0x19;
    }
    else {
      if ((argc - iVar10 < 2) || (snsf_path[0] == '\0')) {
        lVar11 = (long)iVar10;
        local_2068 = (long)argc;
        local_20b4 = 0;
        pcVar6 = local_20b0;
        local_2070 = argv;
        do {
          uVar1 = local_20b4;
          if (local_2068 <= lVar11) {
            if (local_20b4 != 0) {
              fprintf(_stderr,"%d error(s)\n",(ulong)local_20b4);
            }
            return (uint)(uVar1 != 0);
          }
          local_2060 = local_2070[lVar11];
          if (snsf_path[0] == '\0') {
            strcpy(snsf_path,local_2060);
            pcVar6 = path_findext(snsf_path);
            cVar2 = libname[0];
            if (pcVar6 != (char *)0x0) {
              *pcVar6 = '\0';
            }
            sVar7 = strlen(snsf_path);
            pcVar6 = local_20b0;
            if (cVar2 != '\0') {
              builtin_strncpy(snsf_path + sVar7,".minisnsf",10);
              goto LAB_00105a7f;
            }
            builtin_strncpy(snsf_path + sVar7,".snsf",6);
            local_20a8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
            local_20a8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
            local_20a8._M_impl.super__Rb_tree_header._M_header._M_left =
                 &local_20a8._M_impl.super__Rb_tree_header._M_header;
            local_20a8._M_impl.super__Rb_tree_header._M_node_count = 0;
            local_20a8._M_impl.super__Rb_tree_header._M_header._M_right =
                 local_20a8._M_impl.super__Rb_tree_header._M_header._M_left;
          }
          else {
            local_20a8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
            local_20a8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
            local_20a8._M_impl.super__Rb_tree_header._M_node_count = 0;
            local_20a8._M_impl.super__Rb_tree_header._M_header._M_left =
                 &local_20a8._M_impl.super__Rb_tree_header._M_header;
            local_20a8._M_impl.super__Rb_tree_header._M_header._M_right =
                 local_20a8._M_impl.super__Rb_tree_header._M_header._M_left;
            if (libname[0] != '\0') {
LAB_00105a7f:
              local_20a8._M_impl.super__Rb_tree_header._M_header._M_left =
                   &local_20a8._M_impl.super__Rb_tree_header._M_header;
              local_20a8._M_impl.super__Rb_tree_header._M_node_count = 0;
              local_20a8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
              local_20a8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
              local_20a8._M_impl.super__Rb_tree_header._M_header._M_right =
                   local_20a8._M_impl.super__Rb_tree_header._M_header._M_left;
              std::__cxx11::string::string((string *)&local_2058,"_lib",&local_20c1);
              pmVar8 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)&local_20a8,&local_2058);
              std::__cxx11::string::assign((char *)pmVar8);
              std::__cxx11::string::~string((string *)&local_2058);
            }
          }
          if ((pcVar6 != (char *)0x0) && (*pcVar6 != '\0')) {
            std::__cxx11::string::string((string *)&local_2058,"snsfby",&local_20c1);
            pmVar8 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)&local_20a8,&local_2058);
            std::__cxx11::string::assign((char *)pmVar8);
            std::__cxx11::string::~string((string *)&local_2058);
          }
          bVar3 = rom2snsf(local_2060,snsf_path,(uint32_t)local_20c0,
                           (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&local_20a8);
          local_20b4 = local_20b4 + !bVar3;
          puts(snsf_path);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~_Rb_tree(&local_20a8);
          lVar11 = lVar11 + 1;
        } while( true );
      }
      pcVar6 = "Error: Unable to specify output filename for multiple inputs\n";
      sStack_20d0 = 0x3d;
    }
    fwrite(pcVar6,sStack_20d0,1,_stderr);
  }
  return 1;
}

Assistant:

int main(int argc, char *argv[])
{
	if (argc == 1) {
		usage(argv[0]);
		return EXIT_FAILURE;
	}

	long longval;
	char *endptr = NULL;

	uint32_t load_offset = 0;
	char snsf_path[PATH_MAX] = { '\0' };
	char libname[PATH_MAX] = { '\0' };

	char *psfby = NULL;

	int argi = 1;
	while (argi < argc && argv[argi][0] == '-') {
		if (strcmp(argv[argi], "--help") == 0) {
			usage(argv[0]);
			return EXIT_FAILURE;
		}
		else if (strcmp(argv[argi], "-o") == 0) {
			if (argi + 1 >= argc) {
				fprintf(stderr, "Error: Too few arguments for \"%s\"\n", argv[argi]);
				return EXIT_FAILURE;
			}

			strcpy(snsf_path, argv[argi + 1]);

			argi++;
		}
		else if (strcmp(argv[argi], "--load") == 0) {
			if (argi + 1 >= argc) {
				fprintf(stderr, "Error: Too few arguments for \"%s\"\n", argv[argi]);
				return EXIT_FAILURE;
			}

			longval = strtol(argv[argi + 1], &endptr, 16);
			if (*endptr != '\0' || errno == ERANGE || longval < 0)
			{
				fprintf(stderr, "Error: Number format error \"%s\"\n", argv[argi + 1]);
				return EXIT_FAILURE;
			}
			load_offset = longval;

			if (load_offset >= SNES_ROM_MAX_SIZE) {
				fprintf(stderr, "Error: Load offset too large 0x%08X\n", load_offset);
				return EXIT_FAILURE;
			}

			argi++;
		}
		else if (strcmp(argv[argi], "--lib") == 0) {
			if (argi + 1 >= argc) {
				fprintf(stderr, "Error: Too few arguments for \"%s\"\n", argv[argi]);
				return EXIT_FAILURE;
			}

			strcpy(libname, argv[argi + 1]);

			argi++;
		}
		else if (strcmp(argv[argi], "--psfby") == 0 || strcmp(argv[argi], "--snsfby") == 0) {
			if (argi + 1 >= argc) {
				fprintf(stderr, "Error: Too few arguments for \"%s\"\n", argv[argi]);
				return EXIT_FAILURE;
			}

			psfby = argv[argi + 1];

			argi++;
		}
		else {
			fprintf(stderr, "Error: Unknown option \"%s\"\n", argv[argi]);
			return EXIT_FAILURE;
		}
		argi++;
	}

	int argnum = argc - argi;
	if (argnum == 0) {
		fprintf(stderr, "Error: Too few arguments\n");
		return EXIT_FAILURE;
	}
	if (argnum > 1 && strcmp(snsf_path, "") != 0) {
		fprintf(stderr, "Error: Unable to specify output filename for multiple inputs\n");
		return EXIT_FAILURE;
	}

	int num_error = 0;
	for (; argi < argc; argi++) {
		const char * rom_path = argv[argi];
		const char * rom_ext = path_findext(rom_path);

		if (strcmp(snsf_path, "") == 0) {
			strcpy(snsf_path, rom_path);
			path_stripext(snsf_path);
			if (strcmp(libname, "") != 0) {
				strcat(snsf_path, ".minisnsf");
			}
			else {
				strcat(snsf_path, ".snsf");
			}
		}

		std::map<std::string, std::string> tags;
		if (strcmp(libname, "") != 0) {
			tags["_lib"] = libname;
		}

		if (psfby != NULL && strcmp(psfby, "") != 0) {
			tags["snsfby"] = psfby;
		}

		if (!rom2snsf(rom_path, snsf_path, load_offset, tags)) {
			num_error++;
		}

		puts(snsf_path);
	}

	if (num_error != 0) {
		fprintf(stderr, "%d error(s)\n", num_error);
	}

	return (num_error == 0) ? EXIT_SUCCESS : EXIT_FAILURE;
}